

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfunc.cpp
# Opt level: O2

void __thiscall
trun::TestFunc::TestFunc
          (TestFunc *this,string *use_symbolName,string *use_moduleName,string *use_caseName)

{
  ILogger *pIVar1;
  allocator<char> local_49;
  string local_48;
  
  (this->symbolName)._M_dataplus._M_p = (pointer)&(this->symbolName).field_2;
  (this->symbolName)._M_string_length = 0;
  (this->symbolName).field_2._M_local_buf[0] = '\0';
  (this->moduleName)._M_dataplus._M_p = (pointer)&(this->moduleName).field_2;
  (this->moduleName)._M_string_length = 0;
  (this->moduleName).field_2._M_local_buf[0] = '\0';
  (this->caseName)._M_dataplus._M_p = (pointer)&(this->caseName).field_2;
  (this->caseName)._M_string_length = 0;
  (this->caseName).field_2._M_local_buf[0] = '\0';
  this->state = Idle;
  this->execState = None;
  this->testScope = kUnknown;
  this->pLogger = (ILogger *)0x0;
  (this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->dependencies).
  super__Vector_base<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dependencies).
  super__Vector_base<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dependencies).
  super__Vector_base<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pFunc = (PTESTFUNC)0x0;
  this->testReturnCode = -1;
  (this->testResult).super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->testResult).super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->symbolName,use_symbolName);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->moduleName,use_moduleName);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->caseName,use_caseName);
  this->testScope = kUnknown;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"TestFunc",&local_49);
  pIVar1 = gnilk::Logger::GetLogger(&local_48);
  this->pLogger = pIVar1;
  std::__cxx11::string::~string((string *)&local_48);
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0;
  std::__shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->testResult).super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_string_length);
  this->testReturnCode = -1;
  return;
}

Assistant:

TestFunc::TestFunc(const std::string &use_symbolName, const std::string &use_moduleName, const std::string &use_caseName) {
    symbolName = use_symbolName;
    moduleName = use_moduleName;
    caseName = use_caseName;
    testScope = kTestScope::kUnknown;
    pLogger = gnilk::Logger::GetLogger("TestFunc");
    testResult = nullptr;
    testReturnCode = -1;
}